

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

void secp256k1_fe_add(secp256k1_fe *r,secp256k1_fe *a)

{
  r->n[0] = r->n[0] + a->n[0];
  r->n[1] = r->n[1] + a->n[1];
  r->n[2] = r->n[2] + a->n[2];
  r->n[3] = r->n[3] + a->n[3];
  r->n[4] = r->n[4] + a->n[4];
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_add(secp256k1_fe *r, const secp256k1_fe *a) {
#ifdef VERIFY
    secp256k1_fe_verify(a);
#endif
    r->n[0] += a->n[0];
    r->n[1] += a->n[1];
    r->n[2] += a->n[2];
    r->n[3] += a->n[3];
    r->n[4] += a->n[4];
#ifdef VERIFY
    r->magnitude += a->magnitude;
    r->normalized = 0;
    secp256k1_fe_verify(r);
#endif
}